

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall LazyBailOutRecord::Dump(LazyBailOutRecord *this,FunctionBody *functionBody)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  undefined4 extraout_var;
  char16 *pcVar5;
  
  iVar2 = (*(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(functionBody);
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  Output::Print(L"Function %s (#%d.%u, #%u) ",CONCAT44(extraout_var,iVar2),(ulong)uVar3,(ulong)LVar4
                ,(ulong)(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                        m_functionNumber);
  uVar1 = this->bailOutRecord->bailOutOffset;
  pcVar5 = Js::OpCodeUtil::GetOpCodeName(this->bailOutRecord->bailOutOpcode);
  Output::Print(L"Bytecode Offset: #%04x opcode: %s",(ulong)uVar1,pcVar5);
  return;
}

Assistant:

void LazyBailOutRecord::Dump(Js::FunctionBody* functionBody) const
{
    OUTPUT_PRINT(functionBody);
    Output::Print(_u("Bytecode Offset: #%04x opcode: %s"), this->bailOutRecord->GetBailOutOffset(), Js::OpCodeUtil::GetOpCodeName(this->bailOutRecord->GetBailOutOpCode()));
}